

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

bool __thiscall
glcts::ShaderBitfieldOperationCaseUnpackUnorm::test
          (ShaderBitfieldOperationCaseUnpackUnorm *this,Data *data)

{
  float fVar1;
  GLfloat w;
  GLfloat z;
  GLfloat y;
  GLfloat x;
  Data *data_local;
  ShaderBitfieldOperationCaseUnpackUnorm *this_local;
  
  fVar1 = deFloatAbs(data->outVec4[0] - (float)(byte)data->inUvec4[0] / 255.0);
  if (fVar1 <= 0.0001) {
    fVar1 = deFloatAbs(data->outVec4[1] - (float)*(byte *)((long)data->inUvec4 + 1) / 255.0);
    if (fVar1 <= 0.0001) {
      fVar1 = deFloatAbs(data->outVec4[2] - (float)*(byte *)((long)data->inUvec4 + 2) / 255.0);
      if (fVar1 <= 0.0001) {
        fVar1 = deFloatAbs(data->outVec4[3] - (float)*(byte *)((long)data->inUvec4 + 3) / 255.0);
        if (fVar1 <= 0.0001) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool test(Data const* data)
	{
		GLfloat x = float((data->inUvec4[0] >> 0) & 0xFF) / 255.0f;
		if (deFloatAbs(data->outVec4[0] - x) > 0.0001f)
		{
			return false;
		}
		GLfloat y = float((data->inUvec4[0] >> 8) & 0xFF) / 255.0f;
		if (deFloatAbs(data->outVec4[1] - y) > 0.0001f)
		{
			return false;
		}
		GLfloat z = float((data->inUvec4[0] >> 16) & 0xFF) / 255.0f;
		if (deFloatAbs(data->outVec4[2] - z) > 0.0001f)
		{
			return false;
		}
		GLfloat w = float((data->inUvec4[0] >> 24) & 0xFF) / 255.0f;
		if (deFloatAbs(data->outVec4[3] - w) > 0.0001f)
		{
			return false;
		}

		return true;
	}